

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O2

int mbedtls_ecjpake_derive_k
              (mbedtls_ecjpake_context *ctx,mbedtls_ecp_point *K,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  undefined1 local_68 [8];
  mbedtls_mpi one;
  mbedtls_mpi m_xm2_s;
  
  mbedtls_mpi_init((mbedtls_mpi *)&one.s);
  mbedtls_mpi_init((mbedtls_mpi *)local_68);
  iVar1 = mbedtls_mpi_lset((mbedtls_mpi *)local_68,1);
  if (iVar1 == 0) {
    iVar1 = ecjpake_mul_secret((mbedtls_mpi *)&one.s,-1,&ctx->xm2,&ctx->s,&(ctx->grp).N,f_rng,p_rng)
    ;
    if (iVar1 == 0) {
      iVar1 = mbedtls_ecp_muladd(&ctx->grp,K,(mbedtls_mpi *)local_68,&ctx->Xp,(mbedtls_mpi *)&one.s,
                                 &ctx->Xp2);
      if (iVar1 == 0) {
        iVar1 = mbedtls_ecp_mul(&ctx->grp,K,&ctx->xm2,K,f_rng,p_rng);
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)&one.s);
  mbedtls_mpi_free((mbedtls_mpi *)local_68);
  return iVar1;
}

Assistant:

static int mbedtls_ecjpake_derive_k(mbedtls_ecjpake_context *ctx,
                                    mbedtls_ecp_point *K,
                                    int (*f_rng)(void *, unsigned char *, size_t),
                                    void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi m_xm2_s, one;

    mbedtls_mpi_init(&m_xm2_s);
    mbedtls_mpi_init(&one);

    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&one, 1));

    /*
     * Client:  K = ( Xs - X4  * x2  * s ) * x2
     * Server:  K = ( Xc - X2  * x4  * s ) * x4
     * Unified: K = ( Xp - Xp2 * xm2 * s ) * xm2
     */
    MBEDTLS_MPI_CHK(ecjpake_mul_secret(&m_xm2_s, -1, &ctx->xm2, &ctx->s,
                                       &ctx->grp.N, f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_ecp_muladd(&ctx->grp, K,
                                       &one, &ctx->Xp,
                                       &m_xm2_s, &ctx->Xp2));
    MBEDTLS_MPI_CHK(mbedtls_ecp_mul(&ctx->grp, K, &ctx->xm2, K,
                                    f_rng, p_rng));

cleanup:
    mbedtls_mpi_free(&m_xm2_s);
    mbedtls_mpi_free(&one);

    return ret;
}